

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O3

void __thiscall asio::detail::thread_info_base::rethrow_pending_exception(thread_info_base *this)

{
  void *pvVar1;
  undefined8 uVar2;
  exception_ptr ex;
  void *local_20;
  void *local_18;
  
  if (this->has_pending_exception_ < 1) {
    return;
  }
  this->has_pending_exception_ = 0;
  pvVar1 = (this->pending_exception_)._M_exception_object;
  (this->pending_exception_)._M_exception_object = (void *)0x0;
  local_20 = pvVar1;
  local_18 = pvVar1;
  if (pvVar1 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  uVar2 = std::rethrow_exception((exception_ptr)&local_20);
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (pvVar1 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void rethrow_pending_exception()
  {
#if !defined(ASIO_NO_EXCEPTIONS)
    if (has_pending_exception_ > 0)
    {
      has_pending_exception_ = 0;
      std::exception_ptr ex(
          static_cast<std::exception_ptr&&>(
            pending_exception_));
      std::rethrow_exception(ex);
    }
#endif // !defined(ASIO_NO_EXCEPTIONS)
  }